

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  short sVar1;
  int iVar2;
  ImGuiTabBar *tab_bar;
  ImGuiTabItem *pIVar3;
  ImGuiWindow *pIVar4;
  uint *__src;
  ImGuiContext *pIVar5;
  bool bVar6;
  uint *__dest;
  int iVar7;
  int iVar8;
  
  pIVar5 = GImGui;
  if (GImGui->CurrentWindow->SkipItems == false) {
    tab_bar = (GImGui->CurrentTabBar).Data[(long)(GImGui->CurrentTabBar).Size + -1];
    bVar6 = TabItemEx(tab_bar,label,p_open,flags);
    if (((flags & 8U) == 0) && (bVar6)) {
      sVar1 = tab_bar->LastTabItemIdx;
      pIVar3 = (tab_bar->Tabs).Data;
      pIVar4 = pIVar5->CurrentWindow;
      iVar8 = (pIVar4->IDStack).Size;
      iVar2 = (pIVar4->IDStack).Capacity;
      if (iVar8 == iVar2) {
        iVar8 = iVar8 + 1;
        if (iVar2 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar2 / 2 + iVar2;
        }
        if (iVar8 < iVar7) {
          iVar8 = iVar7;
        }
        if (iVar2 < iVar8) {
          __dest = (uint *)MemAlloc((long)iVar8 << 2);
          __src = (pIVar4->IDStack).Data;
          if (__src != (uint *)0x0) {
            memcpy(__dest,__src,(long)(pIVar4->IDStack).Size << 2);
            MemFree((pIVar4->IDStack).Data);
          }
          (pIVar4->IDStack).Data = __dest;
          (pIVar4->IDStack).Capacity = iVar8;
        }
      }
      (pIVar4->IDStack).Data[(pIVar4->IDStack).Size] = pIVar3[sVar1].ID;
      (pIVar4->IDStack).Size = (pIVar4->IDStack).Size + 1;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return false;

    IM_ASSERT(g.CurrentTabBar.Size > 0 && "Needs to be called between BeginTabBar() and EndTabBar()!");
    ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        g.CurrentWindow->IDStack.push_back(tab->ID);    // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}